

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O0

Promise<kj::Maybe<capnp::MessageReaderAndFds>_> __thiscall
capnp::AsyncIoMessageStream::tryReadMessage
          (AsyncIoMessageStream *this,ArrayPtr<kj::OwnFd> fdSpace,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  uint in_R9D;
  ArrayPtr<capnp::word> scratchSpace_00;
  ReaderOptions options_00;
  Promise<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>_> local_40;
  OwnFd *local_38;
  AsyncIoMessageStream *this_local;
  ReaderOptions options_local;
  ArrayPtr<kj::OwnFd> fdSpace_local;
  
  options_local._8_8_ = fdSpace.size_;
  local_38 = fdSpace.ptr;
  this_local = options._8_8_;
  scratchSpace_00.size_ = (size_t)scratchSpace.ptr;
  scratchSpace_00.ptr = (word *)(ulong)in_R9D;
  options_00._8_8_ = this_local;
  options_00.traversalLimitInWords = *(uint64_t *)(local_38 + 2);
  capnp::tryReadMessage((AsyncInputStream *)&local_40,options_00,scratchSpace_00);
  kj::Promise<kj::Maybe<kj::Own<capnp::MessageReader,decltype(nullptr)>>>::
  then<capnp::AsyncIoMessageStream::tryReadMessage(kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>
            ((Promise<kj::Maybe<kj::Own<capnp::MessageReader,decltype(nullptr)>>> *)this,
             (Type *)&local_40);
  kj::Promise<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>_>::~Promise(&local_40);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<MessageReaderAndFds>> AsyncIoMessageStream::tryReadMessage(
    kj::ArrayPtr<kj::OwnFd> fdSpace,
    ReaderOptions options,
    kj::ArrayPtr<word> scratchSpace) {
  return capnp::tryReadMessage(stream, options, scratchSpace)
    .then([](kj::Maybe<kj::Own<MessageReader>> maybeReader) -> kj::Maybe<MessageReaderAndFds> {
      KJ_IF_SOME(reader, maybeReader) {
        return MessageReaderAndFds { kj::mv(reader), nullptr };
      } else {
        return kj::none;
      }
    });
}